

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void free_cond(TCGContext_conflict2 *tcg_ctx,DisasCompare_conflict *c)

{
  if (c->g1 == false) {
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(c->v1 + (long)tcg_ctx));
  }
  if (c->g2 != false) {
    return;
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(c->v2 + (long)tcg_ctx));
  return;
}

Assistant:

static void free_cond(TCGContext *tcg_ctx, DisasCompare *c)
{
    if (!c->g1) {
        tcg_temp_free(tcg_ctx, c->v1);
    }
    if (!c->g2) {
        tcg_temp_free(tcg_ctx, c->v2);
    }
}